

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rle_decoder.cpp
# Opt level: O0

void __thiscall
duckdb::RLEDecoder::Read
          (RLEDecoder *this,uint8_t *defines,idx_t read_count,Vector *result,idx_t result_offset)

{
  ResizeableBuffer *this_00;
  uint8_t *in_RCX;
  ByteBuffer *in_RDX;
  ColumnReader *in_RSI;
  ColumnReader *in_RDI;
  uint64_t in_R8;
  idx_t valid_count;
  
  this_00 = (ResizeableBuffer *)
            ColumnReader::GetValidCount(in_RDI,(uint8_t *)in_RSI,(idx_t)in_RDX,(idx_t)in_RCX);
  ResizeableBuffer::reset(this_00);
  ResizeableBuffer::resize((ResizeableBuffer *)in_RSI,(Allocator *)in_RDX,(uint64_t)in_RCX);
  unique_ptr<duckdb::RleBpDecoder,_std::default_delete<duckdb::RleBpDecoder>,_true>::operator->
            ((unique_ptr<duckdb::RleBpDecoder,_std::default_delete<duckdb::RleBpDecoder>,_true> *)
             this_00);
  RleBpDecoder::GetBatch<unsigned_char>
            ((RleBpDecoder *)in_RSI,(data_ptr_t)in_RDX,(uint32_t)((ulong)in_RCX >> 0x20));
  ColumnReader::PlainTemplated<bool,duckdb::TemplatedParquetValueConversion<bool>>
            (in_RSI,in_RDX,in_RCX,in_R8,(idx_t)this_00,(Vector *)in_RDI);
  return;
}

Assistant:

void RLEDecoder::Read(uint8_t *defines, idx_t read_count, Vector &result, idx_t result_offset) {
	// RLE encoding for boolean
	D_ASSERT(reader.Type().id() == LogicalTypeId::BOOLEAN);
	idx_t valid_count = reader.GetValidCount(defines, read_count, result_offset);
	decoded_data_buffer.reset();
	decoded_data_buffer.resize(reader.reader.allocator, sizeof(bool) * valid_count);
	rle_decoder->GetBatch<uint8_t>(decoded_data_buffer.ptr, valid_count);
	reader.PlainTemplated<bool, TemplatedParquetValueConversion<bool>>(decoded_data_buffer, defines, read_count,
	                                                                   result_offset, result);
}